

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helix.cc
# Opt level: O1

helix_protocol_t helix_protocol_lookup(char *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  pmd_protocol *this;
  allocator local_99;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_98,name,&local_99);
  bVar2 = helix::nasdaq::nordic_itch_protocol::supports(&local_98);
  paVar1 = &local_98.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    this = (pmd_protocol *)operator_new(0x28);
    std::__cxx11::string::string((string *)&local_38,name,(allocator *)&local_98);
    helix::nasdaq::nordic_itch_protocol::nordic_itch_protocol
              ((nordic_itch_protocol *)this,&local_38);
    local_78.field_2._M_allocated_capacity = local_38.field_2._M_allocated_capacity;
    local_78._M_dataplus._M_p = local_38._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p == &local_38.field_2) {
      return (helix_protocol_t)(nordic_itch_protocol *)this;
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_98,name,&local_99);
    bVar2 = helix::nasdaq::itch50_protocol::supports(&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != paVar1) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      this = (pmd_protocol *)operator_new(0x28);
      std::__cxx11::string::string((string *)&local_58,name,(allocator *)&local_98);
      helix::nasdaq::itch50_protocol::itch50_protocol((itch50_protocol *)this,&local_58);
      local_78.field_2._M_allocated_capacity = local_58.field_2._M_allocated_capacity;
      local_78._M_dataplus._M_p = local_58._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p == &local_58.field_2) {
        return (helix_protocol_t)(itch50_protocol *)this;
      }
    }
    else {
      std::__cxx11::string::string((string *)&local_98,name,&local_99);
      bVar2 = helix::parity::pmd_protocol::supports(&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != paVar1) {
        operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
      }
      if (!bVar2) {
        return (helix_protocol_t)0x0;
      }
      this = (pmd_protocol *)operator_new(0x28);
      std::__cxx11::string::string((string *)&local_78,name,(allocator *)&local_98);
      helix::parity::pmd_protocol::pmd_protocol(this,&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p == &local_78.field_2) {
        return (helix_protocol_t)this;
      }
    }
  }
  operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  return (helix_protocol_t)(nordic_itch_protocol *)this;
}

Assistant:

helix_protocol_t helix_protocol_lookup(const char *name)
{
    if (helix::nasdaq::nordic_itch_protocol::supports(name)) {
        return wrap(new helix::nasdaq::nordic_itch_protocol{name});
    }
    if (helix::nasdaq::itch50_protocol::supports(name)) {
        return wrap(new helix::nasdaq::itch50_protocol{name});
    }
    if (helix::parity::pmd_protocol::supports(name)) {
        return wrap(new helix::parity::pmd_protocol{name});
    }
    return NULL;
}